

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O3

int i2d_PKCS7(PKCS7 *a,uchar **out)

{
  ulong size;
  uchar *puVar1;
  
  size = a->length;
  if ((size & 0xffffffff80000000) == 0) {
    if (out == (uchar **)0x0) goto LAB_0021eacc;
    puVar1 = *out;
    if (puVar1 != (uchar *)0x0) {
      if (size == 0) {
        size = 0;
      }
      else {
        memcpy(puVar1,a->asn1,size);
        size = a->length;
        puVar1 = *out;
      }
      *out = puVar1 + size;
      goto LAB_0021eacc;
    }
    puVar1 = (uchar *)OPENSSL_memdup(a->asn1,size);
    *out = puVar1;
    if (puVar1 != (uchar *)0x0) {
      size = a->length;
      goto LAB_0021eacc;
    }
  }
  else {
    ERR_put_error(0x13,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_x509.cc"
                  ,0x144);
  }
  size = 0xffffffff;
LAB_0021eacc:
  return (int)size;
}

Assistant:

int i2d_PKCS7(const PKCS7 *p7, uint8_t **out) {
  if (p7->ber_len > INT_MAX) {
    OPENSSL_PUT_ERROR(PKCS8, ERR_R_OVERFLOW);
    return -1;
  }

  if (out == NULL) {
    return (int)p7->ber_len;
  }

  if (*out == NULL) {
    *out =
        reinterpret_cast<uint8_t *>(OPENSSL_memdup(p7->ber_bytes, p7->ber_len));
    if (*out == NULL) {
      return -1;
    }
  } else {
    OPENSSL_memcpy(*out, p7->ber_bytes, p7->ber_len);
    *out += p7->ber_len;
  }
  return (int)p7->ber_len;
}